

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

void __thiscall branch_and_reduce_algorithm::get_stcut_vertices(branch_and_reduce_algorithm *this)

{
  allocator<int> *this_00;
  pointer *this_01;
  value_type vVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  iterator __first;
  iterator __last;
  reference ppVar6;
  reference pvVar7;
  ulong uVar8;
  size_type sVar9;
  size_t sVar10;
  vector<int,_std::allocator<int>_> *this_02;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong local_3a0;
  uint max_size;
  double perc;
  int i_1;
  int i;
  vector<int,_std::allocator<int>_> vc;
  vector<int,_std::allocator<int>_> local_288;
  int local_270;
  int local_26c;
  int v;
  int u;
  pair<int,_int> edge;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  undefined1 local_240 [4];
  int id;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  biGraph;
  vector<int,_std::allocator<int>_> V;
  vector<int,_std::allocator<int>_> U;
  vector<int,_std::allocator<int>_> reverseMapping;
  undefined1 local_1d8 [8];
  vector<int,_std::allocator<int>_> mapping;
  int s2;
  undefined1 local_198 [8];
  max_flow_algo flow_algo;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> edges;
  vector<int,_std::allocator<int>_> res;
  NodeID v2;
  NodeID v1;
  branch_and_reduce_algorithm *this_local;
  
  std::vector<int,_std::allocator<int>_>::clear(&this->cut);
  iVar3 = get_max_deg_vtx(this);
  this_02 = &this->x;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)iVar3);
  *pvVar5 = 0;
  iVar4 = get_max_deg_vtx(this);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)iVar3);
  *pvVar5 = -1;
  this->s = iVar3;
  this->t = iVar4;
  edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&flow_algo.active
            );
  max_flow_algo::max_flow_algo((max_flow_algo *)local_198,&this->adj,this_02);
  __first = std::vector<int,_std::allocator<int>_>::begin(&this->partition_index);
  __last = std::vector<int,_std::allocator<int>_>::end(&this->partition_index);
  mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 1;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
             (int *)((long)&mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4));
  mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ =
       max_flow_algo::solve_max_flow_min_cut
                 ((max_flow_algo *)local_198,this->rn,this->s,this->t,true,
                  (vector<int,_std::allocator<int>_> *)
                  &edges.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,true,
                  (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                  &flow_algo.active,&this->partition_index);
  iVar3 = this->n;
  reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0xffffffff;
  this_00 = (allocator<int> *)
            ((long)&reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(this_00);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1d8,(long)iVar3,
             (value_type_conflict1 *)
             ((long)&reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &biGraph.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_240);
  __range1._4_4_ = 0;
  __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      &flow_algo.active);
  edge = (pair<int,_int>)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                   ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                    &flow_algo.active);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)&edge);
    if (!bVar2) break;
    ppVar6 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator*(&__end1);
    _v = *ppVar6;
    local_26c = v;
    local_270 = u;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_1d8,(long)v);
    iVar3 = __range1._4_4_;
    if (*pvVar5 == -1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_1d8,(long)local_26c);
      *pvVar5 = iVar3;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 &U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,&local_26c);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 &V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,(value_type_conflict1 *)((long)&__range1 + 4));
      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector(&local_288);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)local_240,&local_288);
      std::vector<int,_std::allocator<int>_>::~vector(&local_288);
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_1d8,(long)local_270);
    iVar3 = __range1._4_4_;
    if (*pvVar5 == -1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_1d8,(long)local_270);
      *pvVar5 = iVar3;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 &U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,&local_270);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 &biGraph.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict1 *)((long)&__range1 + 4));
      vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      this_01 = &vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this_01);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)local_240,(value_type *)this_01);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_1d8,(long)local_26c);
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_240,(long)*pvVar5);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_1d8,(long)local_270);
    std::vector<int,_std::allocator<int>_>::push_back(pvVar7,pvVar5);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_1d8,(long)local_270);
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_240,(long)*pvVar5);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_1d8,(long)local_26c);
    std::vector<int,_std::allocator<int>_>::push_back(pvVar7,pvVar5);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i_1);
  hc_karp((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)local_240,
          (vector<int,_std::allocator<int>_> *)
          &V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage,
          (vector<int,_std::allocator<int>_> *)
          &biGraph.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage,
          (vector<int,_std::allocator<int>_> *)&i_1);
  perc._4_4_ = 0;
  while( true ) {
    uVar8 = (ulong)perc._4_4_;
    sVar9 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&i_1);
    if (sVar9 <= uVar8) break;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i_1,(long)perc._4_4_);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &U.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)*pvVar5);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i_1,(long)perc._4_4_);
    *pvVar5 = vVar1;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i_1,(long)perc._4_4_);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->partition_index,(long)*pvVar5);
    *pvVar5 = 2;
    perc._4_4_ = perc._4_4_ + 1;
  }
  perc._0_4_ = 0;
  while( true ) {
    uVar8 = (ulong)perc._0_4_;
    sVar9 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(&this->adj);
    if (sVar9 <= uVar8) break;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)perc._0_4_);
    if (*pvVar5 < 0) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->partition_index,(long)perc._0_4_);
      if (*pvVar5 == 2) {
        std::vector<int,_std::allocator<int>_>::push_back(&this->cut,(value_type_conflict1 *)&perc);
      }
    }
    perc._0_4_ = perc._0_4_ + 1;
  }
  sVar9 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     &edges.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  auVar12._8_4_ = (int)(sVar9 >> 0x20);
  auVar12._0_8_ = sVar9;
  auVar12._12_4_ = 0x45300000;
  sVar10 = number_of_nodes_remaining(this);
  auVar13._8_4_ = (int)(sVar10 >> 0x20);
  auVar13._0_8_ = sVar10;
  auVar13._12_4_ = 0x45300000;
  dVar11 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar9) - 4503599627370496.0)) /
           ((auVar13._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0));
  if (TUNING_PARAM1 < 0) {
    local_3a0 = (ulong)(int)(((double)-TUNING_PARAM1 / 100.0) * (double)this->rn);
  }
  else {
    local_3a0 = TUNING_PARAM1;
  }
  sVar9 = std::vector<int,_std::allocator<int>_>::size(&this->cut);
  if ((((local_3a0 & 0xffffffff) < sVar9) || (dVar11 < TUNING_PARAM2)) ||
     (1.0 - TUNING_PARAM2 < dVar11)) {
    std::vector<int,_std::allocator<int>_>::clear(&this->cut);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_1);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_240);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &biGraph.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1d8);
  max_flow_algo::~max_flow_algo((max_flow_algo *)local_198);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&flow_algo.active
            );
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void branch_and_reduce_algorithm::get_stcut_vertices()
{
    cut.clear();
    // choose s and t with max deg
    NodeID v1 = get_max_deg_vtx();
    x[v1] = 0;
    NodeID v2 = get_max_deg_vtx();
    x[v1] = -1;

    s = v1;
    t = v2;

    std::vector<int> res = {};
    std::vector<std::pair<int, int>> edges;

    max_flow_algo flow_algo(adj, x);
    std::fill (partition_index.begin(), partition_index.end(), 1);
    int s2 = flow_algo.solve_max_flow_min_cut(rn, s, t, true, res, true, edges, partition_index);

    std::vector<int> mapping(n, -1);
    std::vector<int> reverseMapping;
    std::vector<int> U, V;
    std::vector<std::vector<int>> biGraph;

    int id = 0;
    for (auto edge : edges)
    {
        int u = edge.first;
        int v = edge.second;
        if (mapping[u] == -1)
        {
            mapping[u] = id;
            reverseMapping.push_back(u);
            U.push_back(id);
            biGraph.push_back(std::vector<int>());
            id++;
        }
        if (mapping[v] == -1)
        {
            mapping[v] = id;
            reverseMapping.push_back(v);
            V.push_back(id);
            biGraph.push_back(std::vector<int>());
            id++;
        }

        biGraph[mapping[u]].push_back(mapping[v]);
        biGraph[mapping[v]].push_back(mapping[u]);
    }

    std::vector<int> vc;
    hc_karp(biGraph, U, V, vc);
    for (int i = 0; i < vc.size(); i++)
    {
        vc[i] = reverseMapping[vc[i]];
        partition_index[vc[i]] = 2;
    }

    for (int i = 0; i < adj.size(); ++i)
    {
        if (x[i] < 0 && partition_index[i] == 2)
            cut.push_back(i);
    }

    double perc = (double)res.size() / (double)number_of_nodes_remaining();
    unsigned int max_size = TUNING_PARAM1 >= 0 ? TUNING_PARAM1 : (int)((((double)(-TUNING_PARAM1)) / 100) * (double)rn);
    if (cut.size() > max_size || perc < TUNING_PARAM2 || perc > (1.0 - TUNING_PARAM2))
    {
        // to big, use max. deg. vertex instead
        cut.clear();
    }
}